

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdmiCecAnalyzerResults.cpp
# Opt level: O0

void __thiscall HdmiCecAnalyzerResults::GenHeaderBubble(HdmiCecAnalyzerResults *this,Frame *frame)

{
  Frame FVar1;
  Frame FVar2;
  char *pcVar3;
  string local_2a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8 [39];
  allocator local_1a1;
  string local_1a0 [8];
  string dstName;
  allocator local_179;
  string local_178 [8];
  string srcName;
  string local_158 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118 [32];
  string local_f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8 [39];
  allocator local_91;
  string local_90 [48];
  undefined1 local_60 [8];
  string dstStr;
  undefined1 local_40 [8];
  string srcStr;
  U8 dst;
  U8 src;
  Frame *frame_local;
  HdmiCecAnalyzerResults *this_local;
  
  FVar1 = frame[0x10];
  FVar2 = frame[0x10];
  GetNumberString_abi_cxx11_((HdmiCecAnalyzerResults *)local_40,(U64)this,(uint)((byte)FVar1 >> 4));
  GetNumberString_abi_cxx11_((HdmiCecAnalyzerResults *)local_60,(U64)this,(uint)((byte)FVar2 & 0xf))
  ;
  if ((this->mTabular & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"H",&local_91);
    AddResult(this,(string *)local_90);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    std::operator+((char *)local_f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"H ");
    std::operator+(local_d8,(char *)local_f8);
    std::operator+(local_b8,local_d8);
    AddResult(this,local_b8);
    std::__cxx11::string::~string((string *)local_b8);
    std::__cxx11::string::~string((string *)local_d8);
    std::__cxx11::string::~string(local_f8);
    std::operator+((char *)local_158,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "Header SRC=");
    std::operator+(local_138,(char *)local_158);
    std::operator+(local_118,local_138);
    AddResult(this,local_118);
    std::__cxx11::string::~string((string *)local_118);
    std::__cxx11::string::~string((string *)local_138);
    std::__cxx11::string::~string(local_158);
  }
  pcVar3 = HdmiCec::GetDevAddressString((uint)((byte)FVar1 >> 4));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_178,pcVar3,&local_179);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  pcVar3 = HdmiCec::GetDevAddressString((uint)((byte)FVar2 & 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a0,pcVar3,&local_1a1);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  std::operator+((char *)local_2a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"Header SRC=")
  ;
  std::operator+(local_288,(char *)local_2a8);
  std::operator+(local_268,local_288);
  std::operator+(local_248,(char *)local_268);
  std::operator+(local_228,local_248);
  std::operator+(local_208,(char *)local_228);
  std::operator+(local_1e8,local_208);
  std::operator+(local_1c8,(char *)local_1e8);
  AddResult(this,local_1c8);
  std::__cxx11::string::~string((string *)local_1c8);
  std::__cxx11::string::~string((string *)local_1e8);
  std::__cxx11::string::~string((string *)local_208);
  std::__cxx11::string::~string((string *)local_228);
  std::__cxx11::string::~string((string *)local_248);
  std::__cxx11::string::~string((string *)local_268);
  std::__cxx11::string::~string((string *)local_288);
  std::__cxx11::string::~string(local_2a8);
  std::__cxx11::string::~string(local_1a0);
  std::__cxx11::string::~string(local_178);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void HdmiCecAnalyzerResults::GenHeaderBubble( const Frame& frame )
{
    const U8 src = ( frame.mData1 >> 4 ) & 0xF;
    const U8 dst = ( frame.mData1 >> 0 ) & 0xF;
    std::string srcStr = GetNumberString( src, 4 );
    std::string dstStr = GetNumberString( dst, 4 );

    if( !mTabular )
    {
        AddResult( "H" );
        AddResult( "H " + srcStr + " to " + dstStr );
        AddResult( "Header SRC=" + srcStr + ", DST=" + dstStr );
    }

    std::string srcName = HdmiCec::GetDevAddressString( static_cast<HdmiCec::DevAddress>( src ) );
    std::string dstName = HdmiCec::GetDevAddressString( static_cast<HdmiCec::DevAddress>( dst ) );

    AddResult( "Header SRC=" + srcStr + " (" + srcName + "), DST=" + dstStr + " (" + dstName + ")" );
}